

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t exr_set_lineorder(exr_context_t ctxt,int part_index,exr_lineorder_t lo)

{
  pthread_mutex_t *__mutex;
  exr_priv_part_t p_Var1;
  exr_result_t eVar2;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  exr_context_t nonc;
  
  if (EXR_LINEORDER_RANDOM_Y < lo) {
    eVar2 = (*ctxt->print_error)
                      (ctxt,4,"\'lineOrder\' value for line order (%d) out of range (%d - %d)",
                       (ulong)lo,0,3);
    return eVar2;
  }
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((-1 < part_index) && (part_index < ctxt->num_parts)) {
    if (ctxt->mode == '\x03') {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      UNRECOVERED_JUMPTABLE = ctxt->standard_error;
      eVar2 = 0x15;
    }
    else {
      if (ctxt->mode != '\0') {
        p_Var1 = ctxt->parts[(uint)part_index];
        if (p_Var1->lineOrder == (exr_attribute_t *)0x0) {
          eVar2 = exr_attr_list_add(ctxt,&p_Var1->attributes,"lineOrder",EXR_ATTR_LINEORDER,0,
                                    (uint8_t **)0x0,&p_Var1->lineOrder);
        }
        else {
          eVar2 = 0;
          if (p_Var1->lineOrder->type != EXR_ATTR_LINEORDER) {
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
            eVar2 = (*ctxt->print_error)
                              (ctxt,6,"Invalid required attribute type \'%s\' for \'%s\'",
                               p_Var1->lineOrder->type_name,"lineOrder",ctxt->print_error);
            return eVar2;
          }
        }
        if (eVar2 == 0) {
          (p_Var1->lineOrder->field_6).uc = (uint8_t)lo;
          p_Var1->lineorder = lo;
        }
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        return eVar2;
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      UNRECOVERED_JUMPTABLE = ctxt->standard_error;
      eVar2 = 8;
    }
    eVar2 = (*UNRECOVERED_JUMPTABLE)(ctxt,eVar2);
    return eVar2;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  eVar2 = (*ctxt->print_error)
                    (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,ctxt->print_error
                    );
  return eVar2;
}

Assistant:

exr_result_t
exr_set_lineorder (exr_context_t ctxt, int part_index, exr_lineorder_t lo)
{
    if (lo >= EXR_LINEORDER_LAST_TYPE)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "'lineOrder' value for line order (%d) out of range (%d - %d)",
            (int) lo,
            0,
            (int) EXR_LINEORDER_LAST_TYPE);

    {
        REQ_ATTR_FIND_CREATE (lineOrder, EXR_ATTR_LINEORDER);
        if (rv == EXR_ERR_SUCCESS)
        {
            attr->uc        = (uint8_t) lo;
            part->lineorder = lo;
        }

        return EXR_UNLOCK_AND_RETURN (rv);
    }
}